

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O3

ssize_t __thiscall
TCPConnection::recv(TCPConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  State SVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  ulong uVar5;
  _Elt_pointer extraout_RAX;
  _Elt_pointer ppVar6;
  _Elt_pointer extraout_RAX_00;
  ulong uVar7;
  ushort uVar8;
  undefined4 in_register_00000034;
  long lVar9;
  uint uVar10;
  uchar *puVar12;
  bool bVar13;
  unique_lock<std::mutex> lck1;
  unique_lock<std::mutex> lck0;
  const_iterator local_58;
  void *pvVar11;
  
  uVar7 = (ulong)(uint)__flags;
  lVar9 = CONCAT44(in_register_00000034,__fd);
  uVar8 = *(ushort *)(lVar9 + 0xc);
  uVar10 = uVar8 >> 2 & 0x3c;
  pvVar11 = (void *)(ulong)uVar10;
  if (__buf < pvVar11) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"malformed TCP segment. Size too small.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    sVar4 = std::ostream::flush();
    return sVar4;
  }
  uVar5 = __n & 0xffffffff;
  SVar1 = this->state_;
  if (SVar1 == SYN_SENT) {
    if ((uVar8 >> 10 & 1) == 0) {
      if ((uVar8 >> 9 & 1) == 0) {
        return uVar5;
      }
      uVar10 = *(uint *)(lVar9 + 4);
      uVar10 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
               + 1;
      this->ack_number_ =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 * 0x1000000;
      sVar4 = send(this,0,(void *)0x0,0x1050,__flags);
      this->state_ = ESTABLISHED;
      this->poll_flags_ = this->poll_flags_ | 0x304;
      if ((this->established_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
        return sVar4;
      }
      lck0._M_device = (mutex_type *)((ulong)lck0._M_device & 0xffffffff00000000);
      sVar4 = (*(this->established_cb_)._M_invoker)
                        ((_Any_data *)&this->established_cb_,(int *)&lck0);
      return sVar4;
    }
    if ((uVar8 >> 0xc & 1) == 0) {
      return uVar5;
    }
  }
  else {
    if (SVar1 == CLOSED) {
      if ((uVar8 >> 0xc & 1) == 0) {
        uVar8 = 0x1450;
      }
      else {
        uVar8 = 0x450;
      }
      sVar4 = send(this,0,(void *)0x0,(ulong)uVar8,
                   (uint)(ushort)(*(ushort *)(lVar9 + 2) << 8 | *(ushort *)(lVar9 + 2) >> 8));
      return sVar4;
    }
    if (((uVar8 >> 10 & 1) == 0) ||
       ((uVar5 = (ulong)(SVar1 - ESTABLISHED), 3 < SVar1 - ESTABLISHED &&
        (uVar5 = (ulong)(SVar1 - CLOSING), 2 < SVar1 - CLOSING)))) {
      bVar13 = (uVar8 >> 9 & 1) == 0;
      if (7 < SVar1 - SYN_RECEIVED || bVar13) {
        if ((uVar8 >> 0xc & 1) == 0) {
          return CONCAT71((int7)(uVar5 >> 8),bVar13);
        }
        ppVar6 = (this->send_buf_).
                 super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppVar6 != (this->send_buf_).
                      super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          uVar2 = *(uint *)(lVar9 + 8);
          do {
            lck0._M_owns = false;
            lck0._M_device = &this->_read_m;
            std::unique_lock<std::mutex>::lock(&lck0);
            lck0._M_owns = true;
            ppVar6 = (this->send_buf_).
                     super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            std::unique_lock<std::mutex>::unlock(&lck0);
            __flags = (int)uVar7;
            puVar12 = ppVar6->first;
            uVar3 = *(uint *)(puVar12 + 4);
            if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) <
                (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) +
                (int)ppVar6->second) {
              std::unique_lock<std::mutex>::~unique_lock(&lck0);
              ppVar6 = extraout_RAX;
              break;
            }
            if ((puVar12[0xd] & 1) == 0) {
LAB_001047bc:
              operator_delete__(puVar12);
            }
            else {
              if (this->state_ != LAST_ACK) {
                if (this->state_ == FIN_WAIT_1) {
                  this->state_ = FIN_WAIT_2;
                }
                goto LAB_001047bc;
              }
              this->state_ = CLOSED;
              if ((this->close_cb_).super__Function_base._M_manager == (_Manager_type)0x0)
              goto LAB_001047bc;
              lck1._M_device = (mutex_type *)((ulong)lck1._M_device & 0xffffffff00000000);
              (*(this->close_cb_)._M_invoker)((_Any_data *)&this->close_cb_,(int *)&lck1);
              puVar12 = ppVar6->first;
              if (puVar12 != (uchar *)0x0) goto LAB_001047bc;
            }
            lck1._M_owns = false;
            lck1._M_device = &this->_read_m;
            std::unique_lock<std::mutex>::lock(&lck1);
            lck1._M_owns = true;
            std::
            deque<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
            ::pop_front(&this->send_buf_);
            std::unique_lock<std::mutex>::unlock(&lck1);
            std::unique_lock<std::mutex>::~unique_lock(&lck1);
            std::unique_lock<std::mutex>::~unique_lock(&lck0);
            __flags = (int)uVar7;
            ppVar6 = (this->send_buf_).
                     super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          } while (ppVar6 != (this->send_buf_).
                             super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur);
        }
        if (__buf != pvVar11) {
          lck1._M_device = &this->_read_m;
          lck1._M_owns = false;
          std::unique_lock<std::mutex>::lock(&lck1);
          lck1._M_owns = true;
          local_58._M_cur =
               (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_58._M_first =
               (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first;
          local_58._M_last =
               (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_last;
          local_58._M_node =
               (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
          puVar12 = (uchar *)((long)__buf + lVar9);
          std::deque<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
                    ((iterator *)&lck0,
                     (deque<unsigned_char,std::allocator<unsigned_char>> *)&this->_recv_buf,
                     &local_58,(uchar *)((long)pvVar11 + lVar9),puVar12);
          __flags = (int)puVar12;
          *(byte *)&this->poll_flags_ = (byte)this->poll_flags_ | 0xc3;
          std::unique_lock<std::mutex>::unlock(&lck1);
          uVar2 = this->ack_number_;
          uVar10 = (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
                   + ((int)__buf - uVar10);
          this->ack_number_ =
               uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
               uVar10 * 0x1000000;
          send(this,0,(void *)0x0,0x1050,__flags);
          std::unique_lock<std::mutex>::~unique_lock(&lck1);
          ppVar6 = extraout_RAX_00;
        }
        if ((uVar8 >> 8 & 1) == 0) {
          return (ssize_t)ppVar6;
        }
        uVar10 = this->ack_number_;
        uVar10 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                 uVar10 << 0x18) + 1;
        this->ack_number_ =
             uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 * 0x1000000
        ;
        send(this,0,(void *)0x0,0x1050,__flags);
        if (this->state_ - FIN_WAIT_1 < 2) {
          this->state_ = TIME_WAIT;
          std::thread::
          thread<TCPConnection::recv(unsigned_char_const*,unsigned_long,unsigned_int)::__0,,void>
                    ((thread *)&lck0,(anon_class_8_1_8991fb9c_for__M_head_impl *)this);
          uVar7 = std::thread::detach();
          if (lck0._M_device != (mutex_type *)0x0) {
            std::terminate();
          }
        }
        else {
          uVar10 = this->state_ - SYN_RECEIVED;
          uVar7 = (ulong)uVar10;
          if (uVar10 < 2) {
            this->state_ = CLOSE_WAIT;
          }
        }
        *(byte *)&this->poll_flags_ = (byte)this->poll_flags_ | 0xc3;
        return uVar7;
      }
      uVar10 = this->ack_number_;
      uVar10 = (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
               + 1;
      this->ack_number_ =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 * 0x1000000;
      uVar5 = send(this,0,(void *)0x0,0x1450,__flags);
    }
  }
  this->state_ = CLOSED;
  return uVar5;
}

Assistant:

void TCPConnection::recv(uint8_t const *data, size_t len, uint32_t from_ip) noexcept {
    auto *tcp = reinterpret_cast<tcp_t const *>(data);
    uint16_t flags = tcp->flags;
    uint16_t header_len = ((flags & 0x00f0) >> 4) * 4;
    if (header_len > len) {
        std::cerr << "malformed TCP segment. Size too small." << std::endl;
        return;
    }

    size_t payload_size = len - header_len;

    // step 1 If the state is CLOSED
    if (state_ == State::CLOSED) {
        send(nullptr, 0,
             has_ack(flags) ? get_flags({RST_MASK}) : get_flags({RST_MASK, ACK_MASK}),
             ntohs(tcp->dst_port),
             ntohs(tcp->src_port),
             has_ack(flags) ? tcp->ack : 0,
             has_ack(flags) ? 0 : nl_add_hl(tcp->seq, payload_size),
             src_ip_,
             from_ip
        );
        return;
    }

    // step 2   If the state is LISTEN then

    // step 3   If the state is SYN-SENT then
    if (state_ == State::SYN_SENT) {
        if (has_ack(flags)) {
            //  If SEG.ACK =< ISS, or SEG.ACK > SND.NXT, send a reset (unless
            //  the RST bit is set, if so drop the segment and return)
        }

        if (has_rst(flags)) {
            if (has_ack(flags)) {
                // signal the user "error: connection reset"
                state_ = State::CLOSED;
            }
            return;
        }

        if (has_syn(flags)) {
            ack_number_ = tcp->seq;
            inc_ack_number(1);
            send(nullptr, 0, get_flags({ACK_MASK}));
            state_ = State::ESTABLISHED;
            poll_flags_ |= (POLLOUT | POLLWRNORM | POLLWRBAND);
            if (established_cb_) {
                established_cb_(0);
            }
        }
        return;
    }

    // otherwise
    // first check sequence number
    if (has_rst(flags)) {
        switch (state_) {
            case State::ESTABLISHED:
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
            case State::CLOSE_WAIT:
//                If the RST bit is set then, any outstanding RECEIVEs and SEND
//                should receive "reset" responses.  All segment queues should be
//                flushed.  Users should also receive an unsolicited general
//                "connection reset" signal.  Enter the CLOSED state, delete the
//                TCB, and return.
                state_ = State::CLOSED;
                return;
            case State::CLOSING:
            case State::LAST_ACK:
            case State::TIME_WAIT:
                state_ = State::CLOSED;
                return;
        }
    }

    if (has_syn(flags)) {
        switch (state_) {
            case State::SYN_RECEIVED:
            case State::ESTABLISHED:
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
            case State::CLOSE_WAIT:
            case State::CLOSING:
            case State::LAST_ACK:
            case State::TIME_WAIT:
                inc_ack_number(1);
                send(nullptr, 0, get_flags({RST_MASK, ACK_MASK}));
                state_ = State::CLOSED;
                return;
        }
    }

    if (!has_ack(flags)) {
        return;
    }

    uint32_t acked = ntohl(tcp->ack);
    while (!send_buf_.empty()) {
        std::unique_lock lck0(_read_m);
        auto &p = send_buf_.front();
        lck0.unlock();
        auto *packet = reinterpret_cast<tcp_t *>(p.first);
        uint32_t next_seq = ntohl(nl_add_hl(packet->seq, p.second));
        if (next_seq <= acked) {
            if (has_fin(packet->flags)) {
                if (state_ == State::FIN_WAIT_1) {
                    state_ = State::FIN_WAIT_2;
                } else if (state_ == State::LAST_ACK) {
                    state_ = State::CLOSED;
                    if (close_cb_) {
                        close_cb_(0);
                    }
                }
            }
            delete[] p.first;
            std::unique_lock lck1(_read_m);
            send_buf_.pop_front();
            lck1.unlock();
        } else {
            break;
        }
    }

    if (payload_size > 0) {
        std::unique_lock<std::mutex> lck(_read_m);
        uint8_t const *payload = data + header_len;
        _recv_buf.insert(_recv_buf.end(), payload, payload + payload_size);
        poll_flags_ |= (POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND);
        lck.unlock();
        inc_ack_number(payload_size);
        send(nullptr, 0, get_flags({ACK_MASK}));
    }

    if (has_fin(flags)) {
        inc_ack_number(1);
        send(nullptr, 0, get_flags({ACK_MASK}));

        switch (state_) {
            case State::SYN_RECEIVED:
            case State::ESTABLISHED:
                state_ = State::CLOSE_WAIT;
                break;
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
                state_ = State::TIME_WAIT;
                std::thread([&] {
                    std::this_thread::sleep_for(std::chrono::milliseconds(1000 * 2));
                    state_ = State::CLOSED;
                }).detach();
                break;
            case State::CLOSE_WAIT:
            case State::CLOSING:
            case State::LAST_ACK:
                break;
            case State::TIME_WAIT:
                break;
        }
        poll_flags_ |= (POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND);
    }
}